

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall FIX::double_conversion::Bignum::Zero(Bignum *this)

{
  uint *puVar1;
  int local_14;
  int i;
  Bignum *this_local;
  
  for (local_14 = 0; local_14 < this->used_digits_; local_14 = local_14 + 1) {
    puVar1 = Vector<unsigned_int>::operator[](&this->bigits_,local_14);
    *puVar1 = 0;
  }
  this->used_digits_ = 0;
  this->exponent_ = 0;
  return;
}

Assistant:

void Bignum::Zero() {
  for (int i = 0; i < used_digits_; ++i) {
    bigits_[i] = 0;
  }
  used_digits_ = 0;
  exponent_ = 0;
}